

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::DynamicMapField::MergeFrom(DynamicMapField *this,MapFieldBase *other)

{
  bool bVar1;
  CppType CVar2;
  pointer pvVar3;
  Message *pMVar4;
  MapValueRef *in_RDI;
  FieldDescriptor *field_descriptor;
  MapValueRef *map_val;
  iterator iter;
  const_iterator other_it;
  DynamicMapField *other_field;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *map;
  const_iterator *in_stack_fffffffffffffe58;
  const_iterator *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  MapValueRef *in_stack_ffffffffffffff00;
  int32 in_stack_ffffffffffffff0c;
  MapValueRef *in_stack_ffffffffffffff10;
  MapValueRef *in_stack_ffffffffffffff28;
  DynamicMapField *in_stack_ffffffffffffff30;
  string *local_c0;
  
  (**(code **)((long)in_RDI->data_ + 0xa0))();
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
            ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
             in_stack_fffffffffffffe90);
  while( true ) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end
              ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
               in_stack_fffffffffffffe90);
    bVar1 = protobuf::operator!=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    if (!bVar1) break;
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
              ((const_iterator *)0x434a3d);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find
              ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
               in_stack_fffffffffffffe80,(key_type *)in_stack_fffffffffffffe78);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end
              ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
               in_stack_fffffffffffffe80);
    bVar1 = protobuf::operator==
                      ((iterator *)in_stack_fffffffffffffe60,(iterator *)in_stack_fffffffffffffe58);
    if (bVar1) {
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
                ((const_iterator *)0x434aa3);
      local_c0 = (string *)
                 Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                           ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
                            in_stack_fffffffffffffe70,(key_type *)in_stack_fffffffffffffe68);
      AllocateMapValue(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    else {
      pvVar3 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator->
                         ((iterator *)0x434adc);
      local_c0 = (string *)&pvVar3->second;
    }
    Message::GetDescriptor((Message *)in_stack_fffffffffffffe60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff00,"value",(allocator *)&stack0xfffffffffffffeff);
    Descriptor::FindFieldByName((Descriptor *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeff);
    CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x434b78);
    switch(CVar2) {
    case CPPTYPE_INT32:
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
                ((const_iterator *)0x434c02);
      MapValueRef::GetInt32Value(in_RDI);
      MapValueRef::SetInt32Value(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      break;
    case CPPTYPE_INT64:
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
                ((const_iterator *)0x434c39);
      MapValueRef::GetInt64Value(in_RDI);
      MapValueRef::SetInt64Value
                (in_stack_ffffffffffffff00,
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      break;
    case CPPTYPE_UINT32:
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
                ((const_iterator *)0x434c71);
      MapValueRef::GetUInt32Value(in_RDI);
      MapValueRef::SetUInt32Value(in_stack_ffffffffffffff00,(uint32)in_stack_fffffffffffffefc);
      break;
    case CPPTYPE_UINT64:
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
                ((const_iterator *)0x434ca8);
      MapValueRef::GetUInt64Value(in_RDI);
      MapValueRef::SetUInt64Value
                (in_stack_ffffffffffffff00,
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      in_stack_fffffffffffffe90 = local_c0;
      break;
    case CPPTYPE_DOUBLE:
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
                ((const_iterator *)0x434d15);
      MapValueRef::GetDoubleValue(in_RDI);
      MapValueRef::SetDoubleValue
                (in_stack_ffffffffffffff00,
                 (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      in_stack_fffffffffffffe80 = local_c0;
      break;
    case CPPTYPE_FLOAT:
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
                ((const_iterator *)0x434ce0);
      MapValueRef::GetFloatValue(in_RDI);
      MapValueRef::SetFloatValue(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      break;
    case CPPTYPE_BOOL:
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
                ((const_iterator *)0x434d4a);
      MapValueRef::GetBoolValue(in_RDI);
      MapValueRef::SetBoolValue
                (in_stack_ffffffffffffff00,(bool)SUB41((uint)in_stack_fffffffffffffefc >> 0x18,0));
      in_stack_fffffffffffffe78 = local_c0;
      break;
    case CPPTYPE_ENUM:
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
                ((const_iterator *)0x434dba);
      MapValueRef::GetEnumValue(in_RDI);
      MapValueRef::SetEnumValue(in_stack_ffffffffffffff00,(int)in_stack_fffffffffffffefc);
      in_stack_fffffffffffffe68 = local_c0;
      break;
    case CPPTYPE_STRING:
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
                ((const_iterator *)0x434d85);
      MapValueRef::GetStringValue_abi_cxx11_(in_RDI);
      MapValueRef::SetStringValue
                (in_stack_ffffffffffffff00,
                 (string *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      in_stack_fffffffffffffe70 = local_c0;
      break;
    case CPPTYPE_MESSAGE:
      in_stack_fffffffffffffe60 = (const_iterator *)MapValueRef::MutableMessageValue(in_RDI);
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
                ((const_iterator *)0x434df3);
      pMVar4 = MapValueRef::GetMessageValue(in_RDI);
      (*(code *)(in_stack_fffffffffffffe60->it_).node_[4].kv.k_.val_)
                (in_stack_fffffffffffffe60,pMVar4);
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator++
              (in_stack_fffffffffffffe60);
  }
  return;
}

Assistant:

void DynamicMapField::MergeFrom(const MapFieldBase& other) {
  GOOGLE_DCHECK(IsMapValid() && other.IsMapValid());
  Map<MapKey, MapValueRef>* map = MutableMap();
  const DynamicMapField& other_field =
      reinterpret_cast<const DynamicMapField&>(other);
  for (Map<MapKey, MapValueRef>::const_iterator other_it =
           other_field.map_.begin();
       other_it != other_field.map_.end(); ++other_it) {
    Map<MapKey, MapValueRef>::iterator iter = map->find(other_it->first);
    MapValueRef* map_val;
    if (iter == map->end()) {
      map_val = &map_[other_it->first];
      AllocateMapValue(map_val);
    } else {
      map_val = &iter->second;
    }

    // Copy map value
    const FieldDescriptor* field_descriptor =
        default_entry_->GetDescriptor()->FindFieldByName("value");
    switch (field_descriptor->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        map_val->SetInt32Value(other_it->second.GetInt32Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_INT64: {
        map_val->SetInt64Value(other_it->second.GetInt64Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_UINT32: {
        map_val->SetUInt32Value(other_it->second.GetUInt32Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_UINT64: {
        map_val->SetUInt64Value(other_it->second.GetUInt64Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_FLOAT: {
        map_val->SetFloatValue(other_it->second.GetFloatValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_DOUBLE: {
        map_val->SetDoubleValue(other_it->second.GetDoubleValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_BOOL: {
        map_val->SetBoolValue(other_it->second.GetBoolValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_STRING: {
        map_val->SetStringValue(other_it->second.GetStringValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_ENUM: {
        map_val->SetEnumValue(other_it->second.GetEnumValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        map_val->MutableMessageValue()->CopyFrom(
            other_it->second.GetMessageValue());
        break;
      }
    }
  }
}